

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

void miRegionOp(QRegionPrivate *dest,QRegionPrivate *reg1,QRegionPrivate *reg2,
               OverlapFunc overlapFunc,NonOverlapFunc nonOverlap1Func,NonOverlapFunc nonOverlap2Func
               )

{
  int iVar1;
  int iVar2;
  QRect *pQVar3;
  ulong uVar4;
  int iVar5;
  uint curStart;
  QRect *pQVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QRect *pQVar11;
  QRect *pQVar12;
  QRect *pQVar13;
  Representation *pRVar14;
  QRect *pQVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<QRect> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = reg1->numRects;
  if ((long)iVar2 == 1) {
    pQVar3 = &reg1->extents;
  }
  else {
    pQVar3 = (reg1->rects).d.ptr;
  }
  iVar9 = reg2->numRects;
  if ((long)iVar9 == 1) {
    pQVar6 = &reg2->extents;
  }
  else {
    pQVar6 = (reg2->rects).d.ptr;
  }
  QRegionPrivate::vectorize(dest);
  local_50.d = (dest->rects).d.d;
  local_50.ptr = (dest->rects).d.ptr;
  local_50.size = (dest->rects).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar11 = pQVar3 + iVar2;
  dest->numRects = 0;
  pQVar12 = pQVar6 + iVar9;
  iVar2 = reg2->numRects;
  if (reg2->numRects < reg1->numRects) {
    iVar2 = reg1->numRects;
  }
  QList<QRect>::resize(&dest->rects,(long)(iVar2 * 2));
  iVar2 = (reg1->extents).y1.m_i;
  iVar9 = (reg2->extents).y1.m_i;
  if (iVar2 < iVar9) {
    iVar9 = iVar2;
  }
  iVar9 = iVar9 + -1;
  iVar2 = 0;
  do {
    iVar10 = dest->numRects;
    pRVar14 = &pQVar3->y1;
    for (pQVar15 = pQVar3; (pQVar15 != pQVar11 && ((pQVar15->y1).m_i == pRVar14->m_i));
        pQVar15 = pQVar15 + 1) {
    }
    iVar8 = (pQVar6->y1).m_i;
    for (pQVar13 = pQVar6; (pQVar13 != pQVar12 && ((pQVar13->y1).m_i == iVar8));
        pQVar13 = pQVar13 + 1) {
    }
    iVar5 = pRVar14->m_i;
    if (iVar5 < iVar8) {
      iVar1 = iVar9 + 1;
      if (iVar9 + 1 < iVar5) {
        iVar1 = iVar5;
      }
      iVar9 = (pQVar3->y2).m_i;
      iVar7 = iVar8 + -1;
      if (iVar9 < iVar8 + -1) {
        iVar7 = iVar9;
      }
      iVar5 = iVar8;
      if ((nonOverlap1Func != (NonOverlapFunc)0x0) && (iVar1 <= iVar7)) {
        (*nonOverlap1Func)(dest,pQVar3,pQVar15,iVar1,iVar7);
        pRVar14 = &pQVar6->y1;
LAB_003d38d1:
        iVar5 = pRVar14->m_i;
      }
    }
    else if (iVar8 < iVar5) {
      iVar1 = iVar9 + 1;
      if (iVar9 + 1 < iVar8) {
        iVar1 = iVar8;
      }
      iVar9 = (pQVar6->y2).m_i;
      iVar8 = iVar5 + -1;
      if (iVar9 < iVar5 + -1) {
        iVar8 = iVar9;
      }
      if ((nonOverlap2Func != (NonOverlapFunc)0x0) && (iVar1 <= iVar8)) {
        (*nonOverlap2Func)(dest,pQVar6,pQVar13,iVar1,iVar8);
        goto LAB_003d38d1;
      }
    }
    if (dest->numRects != iVar10) {
      iVar2 = miCoalesce(dest,iVar2,iVar10);
      iVar10 = dest->numRects;
    }
    iVar8 = (pQVar3->y2).m_i;
    iVar9 = (pQVar6->y2).m_i;
    if (iVar8 < iVar9) {
      iVar9 = iVar8;
    }
    if ((iVar5 <= iVar9) &&
       ((*overlapFunc)(dest,pQVar3,pQVar15,pQVar6,pQVar13,iVar5,iVar9), dest->numRects != iVar10)) {
      iVar2 = miCoalesce(dest,iVar2,iVar10);
    }
    if ((pQVar3->y2).m_i != iVar9) {
      pQVar15 = pQVar3;
    }
    if ((pQVar6->y2).m_i == iVar9) {
      pQVar6 = pQVar13;
    }
    if ((pQVar15 == pQVar11) || (pQVar3 = pQVar15, pQVar6 == pQVar12)) {
      curStart = dest->numRects;
      if (pQVar15 == pQVar11) {
        if ((nonOverlap2Func != (NonOverlapFunc)0x0) && (pQVar6 != pQVar12)) {
          do {
            iVar10 = (pQVar6->y1).m_i;
            for (pQVar3 = pQVar6; (pQVar3 < pQVar12 && ((pQVar3->y1).m_i == iVar10));
                pQVar3 = pQVar3 + 1) {
            }
            if (iVar10 <= iVar9 + 1) {
              iVar10 = iVar9 + 1;
            }
            (*nonOverlap2Func)(dest,pQVar6,pQVar3,iVar10,(pQVar6->y2).m_i);
            pQVar6 = pQVar3;
          } while (pQVar3 != pQVar12);
        }
      }
      else if (nonOverlap1Func != (NonOverlapFunc)0x0) {
        do {
          iVar10 = (pQVar15->y1).m_i;
          for (pQVar3 = pQVar15; (pQVar3 < pQVar11 && ((pQVar3->y1).m_i == iVar10));
              pQVar3 = pQVar3 + 1) {
          }
          if (iVar10 <= iVar9 + 1) {
            iVar10 = iVar9 + 1;
          }
          (*nonOverlap1Func)(dest,pQVar15,pQVar3,iVar10,(pQVar15->y2).m_i);
          pQVar15 = pQVar3;
        } while (pQVar3 != pQVar11);
      }
      if (dest->numRects != curStart) {
        miCoalesce(dest,iVar2,curStart);
        curStart = dest->numRects;
      }
      uVar4 = 4;
      if (4 < (int)curStart) {
        uVar4 = (ulong)curStart;
      }
      if (uVar4 < (ulong)(dest->rects).d.size >> 1) {
        QList<QRect>::resize(&dest->rects,(long)(int)curStart);
      }
      QArrayDataPointer<QRect>::~QArrayDataPointer(&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

static void miRegionOp(QRegionPrivate &dest,
                       const QRegionPrivate *reg1, const QRegionPrivate *reg2,
                       OverlapFunc overlapFunc, NonOverlapFunc nonOverlap1Func,
                       NonOverlapFunc nonOverlap2Func)
{
    const QRect *r1;         // Pointer into first region
    const QRect *r2;         // Pointer into 2d region
    const QRect *r1End;               // End of 1st region
    const QRect *r2End;               // End of 2d region
    int ybot;          // Bottom of intersection
    int ytop;          // Top of intersection
    int prevBand;               // Index of start of previous band in dest
    int curBand;                // Index of start of current band in dest
    const QRect *r1BandEnd;  // End of current band in r1
    const QRect *r2BandEnd;  // End of current band in r2
    int top;                    // Top of non-overlapping band
    int bot;                    // Bottom of non-overlapping band

    /*
     * Initialization:
     *  set r1, r2, r1End and r2End appropriately, preserve the important
     * parts of the destination region until the end in case it's one of
     * the two source regions, then mark the "new" region empty, allocating
     * another array of rectangles for it to use.
     */
    if (reg1->numRects == 1)
        r1 = &reg1->extents;
    else
        r1 = reg1->rects.constData();
    if (reg2->numRects == 1)
        r2 = &reg2->extents;
    else
        r2 = reg2->rects.constData();

    r1End = r1 + reg1->numRects;
    r2End = r2 + reg2->numRects;

    dest.vectorize();

    /*
     * The following calls are going to detach dest.rects. Since dest might be
     * aliasing *reg1 and/or *reg2, and we could have active iterators on
     * reg1->rects and reg2->rects (if the regions have more than 1 rectangle),
     * take a copy of dest.rects to keep those iteractors valid.
     */
    const QList<QRect> destRectsCopy = dest.rects;
    Q_UNUSED(destRectsCopy);

    dest.numRects = 0;

    /*
     * Allocate a reasonable number of rectangles for the new region. The idea
     * is to allocate enough so the individual functions don't need to
     * reallocate and copy the array, which is time consuming, yet we don't
     * have to worry about using too much memory. I hope to be able to
     * nuke the realloc() at the end of this function eventually.
     */
    dest.rects.resize(qMax(reg1->numRects,reg2->numRects) * 2);

    /*
     * Initialize ybot and ytop.
     * In the upcoming loop, ybot and ytop serve different functions depending
     * on whether the band being handled is an overlapping or non-overlapping
     * band.
     *  In the case of a non-overlapping band (only one of the regions
     * has points in the band), ybot is the bottom of the most recent
     * intersection and thus clips the top of the rectangles in that band.
     * ytop is the top of the next intersection between the two regions and
     * serves to clip the bottom of the rectangles in the current band.
     *  For an overlapping band (where the two regions intersect), ytop clips
     * the top of the rectangles of both regions and ybot clips the bottoms.
     */
    if (reg1->extents.top() < reg2->extents.top())
        ybot = reg1->extents.top() - 1;
    else
        ybot = reg2->extents.top() - 1;

    /*
     * prevBand serves to mark the start of the previous band so rectangles
     * can be coalesced into larger rectangles. qv. miCoalesce, above.
     * In the beginning, there is no previous band, so prevBand == curBand
     * (curBand is set later on, of course, but the first band will always
     * start at index 0). prevBand and curBand must be indices because of
     * the possible expansion, and resultant moving, of the new region's
     * array of rectangles.
     */
    prevBand = 0;

    do {
        curBand = dest.numRects;

        /*
         * This algorithm proceeds one source-band (as opposed to a
         * destination band, which is determined by where the two regions
         * intersect) at a time. r1BandEnd and r2BandEnd serve to mark the
         * rectangle after the last one in the current band for their
         * respective regions.
         */
        r1BandEnd = r1;
        while (r1BandEnd != r1End && r1BandEnd->top() == r1->top())
            ++r1BandEnd;

        r2BandEnd = r2;
        while (r2BandEnd != r2End && r2BandEnd->top() == r2->top())
            ++r2BandEnd;

        /*
         * First handle the band that doesn't intersect, if any.
         *
         * Note that attention is restricted to one band in the
         * non-intersecting region at once, so if a region has n
         * bands between the current position and the next place it overlaps
         * the other, this entire loop will be passed through n times.
         */
        if (r1->top() < r2->top()) {
            top = qMax(r1->top(), ybot + 1);
            bot = qMin(r1->bottom(), r2->top() - 1);

            if (nonOverlap1Func != nullptr && bot >= top)
                (*nonOverlap1Func)(dest, r1, r1BandEnd, top, bot);
            ytop = r2->top();
        } else if (r2->top() < r1->top()) {
            top = qMax(r2->top(), ybot + 1);
            bot = qMin(r2->bottom(), r1->top() - 1);

            if (nonOverlap2Func != nullptr && bot >= top)
                (*nonOverlap2Func)(dest, r2, r2BandEnd, top, bot);
            ytop = r1->top();
        } else {
            ytop = r1->top();
        }

        /*
         * If any rectangles got added to the region, try and coalesce them
         * with rectangles from the previous band. Note we could just do
         * this test in miCoalesce, but some machines incur a not
         * inconsiderable cost for function calls, so...
         */
        if (dest.numRects != curBand)
            prevBand = miCoalesce(dest, prevBand, curBand);

        /*
         * Now see if we've hit an intersecting band. The two bands only
         * intersect if ybot >= ytop
         */
        ybot = qMin(r1->bottom(), r2->bottom());
        curBand = dest.numRects;
        if (ybot >= ytop)
            (*overlapFunc)(dest, r1, r1BandEnd, r2, r2BandEnd, ytop, ybot);

        if (dest.numRects != curBand)
            prevBand = miCoalesce(dest, prevBand, curBand);

        /*
         * If we've finished with a band (y2 == ybot) we skip forward
         * in the region to the next band.
         */
        if (r1->bottom() == ybot)
            r1 = r1BandEnd;
        if (r2->bottom() == ybot)
            r2 = r2BandEnd;
    } while (r1 != r1End && r2 != r2End);

    /*
     * Deal with whichever region still has rectangles left.
     */
    curBand = dest.numRects;
    if (r1 != r1End) {
        if (nonOverlap1Func != nullptr) {
            do {
                r1BandEnd = r1;
                while (r1BandEnd < r1End && r1BandEnd->top() == r1->top())
                    ++r1BandEnd;
                (*nonOverlap1Func)(dest, r1, r1BandEnd, qMax(r1->top(), ybot + 1), r1->bottom());
                r1 = r1BandEnd;
            } while (r1 != r1End);
        }
    } else if ((r2 != r2End) && (nonOverlap2Func != nullptr)) {
        do {
            r2BandEnd = r2;
            while (r2BandEnd < r2End && r2BandEnd->top() == r2->top())
                 ++r2BandEnd;
            (*nonOverlap2Func)(dest, r2, r2BandEnd, qMax(r2->top(), ybot + 1), r2->bottom());
            r2 = r2BandEnd;
        } while (r2 != r2End);
    }

    if (dest.numRects != curBand)
        (void)miCoalesce(dest, prevBand, curBand);

    /*
     * A bit of cleanup. To keep regions from growing without bound,
     * we shrink the array of rectangles to match the new number of
     * rectangles in the region.
     *
     * Only do this stuff if the number of rectangles allocated is more than
     * twice the number of rectangles in the region (a simple optimization).
     */
    if (qMax(4, dest.numRects) < (dest.rects.size() >> 1))
        dest.rects.resize(dest.numRects);
}